

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::ToVar(GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *bv,BasicBlock *block,
              Instr *insertBeforeInstr)

{
  Type TVar1;
  BasicBlock *pBVar2;
  Opnd *pOVar3;
  bool bVar4;
  StackSym *sym;
  SparseBVUnit regOpnd;
  Func **ppFVar5;
  RegOpnd *pRVar6;
  long lVar7;
  Instr *pIVar8;
  BVUnitT<unsigned_long> local_40;
  SparseBVUnit _unit;
  
  do {
    bv = (BVSparse<Memory::JitArenaAllocator> *)bv->head;
    if (bv == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return;
    }
    TVar1 = *(Type *)&bv->lastFoundIndex;
    local_40.word = ((Type *)&bv->alloc)->word;
    while (local_40.word != 0) {
      lVar7 = 0;
      if (local_40.word != 0) {
        for (; (local_40.word >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear(&local_40,(BVIndex)lVar7);
      sym = SymTable::FindStackSym(this->func->m_symTable,TVar1 + (BVIndex)lVar7);
      regOpnd.word = (Type)IR::RegOpnd::New(sym,TyVar,this->func);
      pBVar2 = block->next;
      ppFVar5 = (Func **)&pBVar2->firstInstr;
      if (pBVar2 == (BasicBlock *)0x0) {
        ppFVar5 = &block->func;
      }
      lVar7 = 0x18;
      if (pBVar2 == (BasicBlock *)0x0) {
        lVar7 = 0xd0;
      }
      pIVar8 = insertBeforeInstr;
      if (insertBeforeInstr == (Instr *)0x0) {
        pIVar8 = *(Instr **)((long)&(*ppFVar5)->m_alloc + lVar7);
        if ((pIVar8->m_kind != InstrKindBranch) && (pIVar8->m_opcode != BailTarget)) {
          pIVar8 = pIVar8->m_next;
          goto LAB_0041ac7c;
        }
        pOVar3 = pIVar8->m_src1;
        if (pOVar3 != (Opnd *)0x0) {
          _unit.word = regOpnd.word;
          bVar4 = IR::Opnd::IsRegOpnd(pOVar3);
          if ((bVar4) && (pRVar6 = IR::Opnd::AsRegOpnd(pOVar3), pRVar6->m_sym == sym)) {
            IR::Instr::HoistSrc1(pIVar8,Ld_A,RegNOREG,(StackSym *)0x0);
          }
          pOVar3 = pIVar8->m_src2;
          regOpnd.word = _unit.word;
          if (((pOVar3 != (Opnd *)0x0) &&
              (bVar4 = IR::Opnd::IsRegOpnd(pOVar3), regOpnd = _unit, bVar4)) &&
             (pRVar6 = IR::Opnd::AsRegOpnd(pOVar3), regOpnd = _unit, pRVar6->m_sym == sym)) {
            IR::Instr::HoistSrc2(pIVar8,Ld_A,RegNOREG,(StackSym *)0x0);
            regOpnd = _unit;
          }
        }
        ToVar(this,pIVar8,(RegOpnd *)regOpnd.word,block,(Value *)0x0,false);
      }
      else {
LAB_0041ac7c:
        ToVar(this,pIVar8,(RegOpnd *)regOpnd.word,block,(Value *)0x0,false);
      }
    }
  } while( true );
}

Assistant:

void
GlobOpt::ToVar(BVSparse<JitArenaAllocator> *bv, BasicBlock *block, IR::Instr* insertBeforeInstr /* = nullptr */)
{
    FOREACH_BITSET_IN_SPARSEBV(id, bv)
    {
        StackSym *stackSym = this->func->m_symTable->FindStackSym(id);
        IR::RegOpnd *newOpnd = IR::RegOpnd::New(stackSym, TyVar, this->func);
        IR::Instr* lastInstr = block->GetLastInstr();

        if (insertBeforeInstr != nullptr)
        {
            this->ToVar(insertBeforeInstr, newOpnd, block, nullptr, false);
        }
        else if (lastInstr->IsBranchInstr() || lastInstr->m_opcode == Js::OpCode::BailTarget)
        {
            // If branch is using this symbol, hoist the operand as the ToVar load will get
            // inserted right before the branch.
            IR::Opnd *src1 = lastInstr->GetSrc1();
            if (src1)
            {
                if (src1->IsRegOpnd() && src1->AsRegOpnd()->m_sym == stackSym)
                {
                    lastInstr->HoistSrc1(Js::OpCode::Ld_A);
                }
                IR::Opnd *src2 = lastInstr->GetSrc2();
                if (src2)
                {
                    if (src2->IsRegOpnd() && src2->AsRegOpnd()->m_sym == stackSym)
                    {
                        lastInstr->HoistSrc2(Js::OpCode::Ld_A);
                    }
                }
            }
            this->ToVar(lastInstr, newOpnd, block, nullptr, false);
        }
        else
        {
            IR::Instr *lastNextInstr = lastInstr->m_next;
            this->ToVar(lastNextInstr, newOpnd, block, nullptr, false);
        }
    } NEXT_BITSET_IN_SPARSEBV;
}